

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain_array
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  string *this_00;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  ID local_2f8;
  uint local_2f4;
  undefined1 local_2f0 [8];
  SmallVector<unsigned_int,_8UL> subcomposite_chain;
  undefined1 local_298 [8];
  SPIRAccessChain subchain;
  ID local_1c0;
  bool local_1b9;
  undefined1 local_1b8 [8];
  SPIRType int_type;
  uint32_t int_type_id;
  uint32_t local_54;
  undefined1 local_50 [4];
  uint32_t id;
  string ident;
  SPIRType *type;
  SmallVector<unsigned_int,_8UL> *composite_chain_local;
  uint32_t value_local;
  SPIRAccessChain *chain_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  get_unique_identifier_abi_cxx11_((CompilerHLSL *)local_50);
  local_54 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
  int_type.member_name_cache._M_h._M_single_bucket._0_4_ = local_54 + 1;
  SPIRType::SPIRType((SPIRType *)local_1b8);
  int_type.super_IVariant._vptr_IVariant._4_4_ = 7;
  int_type.super_IVariant.self.id = 0x20;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,(uint32_t)int_type.member_name_cache._M_h._M_single_bucket,
             (SPIRType *)local_1b8);
  local_1b9 = true;
  Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
            ((Compiler *)this,local_54,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (uint *)&int_type.member_name_cache._M_h._M_single_bucket,&local_1b9);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_1c0,local_54);
  Compiler::set_name((Compiler *)this,local_1c0,(string *)local_50);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::insert(&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking,&local_54);
  CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
  VectorView<unsigned_int>::size(&(pSVar3->array).super_VectorView<unsigned_int>);
  CompilerGLSL::to_array_size_abi_cxx11_
            ((CompilerGLSL *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18),
             (SPIRType *)this,(uint32_t)pSVar3);
  CompilerGLSL::
  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [10])"for (int ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [7])" = 0; ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [4])" < ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (subchain.implied_read_expressions.stack_storage.aligned_char + 0x18),
             (char (*) [3])0x4e3ed3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [4])0x4e03b1);
  ::std::__cxx11::string::~string
            ((string *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18));
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::SPIRAccessChain((SPIRAccessChain *)local_298,chain);
  join<std::__cxx11::string&,char_const(&)[4],unsigned_int_const&,char_const(&)[4],std::__cxx11::string_const&>
            ((spirv_cross *)(subcomposite_chain.stack_storage.aligned_char + 0x18),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [4])0x4f3a06,&chain->array_stride,(char (*) [4])0x4f3a30,
             &chain->dynamic_index);
  this_00 = (string *)(subcomposite_chain.stack_storage.aligned_char + 0x18);
  ::std::__cxx11::string::operator=((string *)&subchain.field_0x30,this_00);
  ::std::__cxx11::string::~string(this_00);
  subchain.super_IVariant._vptr_IVariant._4_4_ = (pSVar3->parent_type).id;
  SmallVector<unsigned_int,_8UL>::SmallVector
            ((SmallVector<unsigned_int,_8UL> *)local_2f0,composite_chain);
  local_2f4 = local_54 | 0x80000000;
  SmallVector<unsigned_int,_8UL>::push_back((SmallVector<unsigned_int,_8UL> *)local_2f0,&local_2f4);
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&subchain.super_IVariant._vptr_IVariant + 4));
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty(&(pSVar3->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
              (&local_2f8,
               (TypedID<(spirv_cross::Types)1> *)((long)&subchain.super_IVariant._vptr_IVariant + 4)
              );
    subchain.loaded_from.id =
         Compiler::get_decoration((Compiler *)this,local_2f8,DecorationArrayStride);
  }
  write_access_chain(this,(SPIRAccessChain *)local_298,value,
                     (SmallVector<unsigned_int,_8UL> *)local_2f0);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_2f0);
  SPIRAccessChain::~SPIRAccessChain((SPIRAccessChain *)local_298);
  SPIRType::~SPIRType((SPIRType *)local_1b8);
  ::std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void CompilerHLSL::write_access_chain_array(const SPIRAccessChain &chain, uint32_t value,
                                            const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Need to use a reserved identifier here since it might shadow an identifier in the access chain input or other loops.
	auto ident = get_unique_identifier();

	uint32_t id = ir.increase_bound_by(2);
	uint32_t int_type_id = id + 1;
	SPIRType int_type;
	int_type.basetype = SPIRType::Int;
	int_type.width = 32;
	set<SPIRType>(int_type_id, int_type);
	set<SPIRExpression>(id, ident, int_type_id, true);
	set_name(id, ident);
	suppressed_usage_tracking.insert(id);

	statement("[unroll]");
	statement("for (int ", ident, " = 0; ", ident, " < ", to_array_size(type, uint32_t(type.array.size() - 1)), "; ",
	          ident, "++)");
	begin_scope();
	auto subchain = chain;
	subchain.dynamic_index = join(ident, " * ", chain.array_stride, " + ", chain.dynamic_index);
	subchain.basetype = type.parent_type;

	// Forcefully allow us to use an ID here by setting MSB.
	auto subcomposite_chain = composite_chain;
	subcomposite_chain.push_back(0x80000000u | id);

	if (!get<SPIRType>(subchain.basetype).array.empty())
		subchain.array_stride = get_decoration(subchain.basetype, DecorationArrayStride);

	write_access_chain(subchain, value, subcomposite_chain);
	end_scope();
}